

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::V_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::V_const&> *this,
          int *rhs)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  ostringstream os_1;
  ostringstream os;
  allocator local_421;
  long *local_420;
  size_type local_418;
  long local_410;
  undefined8 uStack_408;
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined1 local_3f0 [8];
  undefined8 uStack_3e8;
  string local_3e0;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0 [8];
  undefined8 uStack_3a8;
  long *local_3a0;
  size_type local_398;
  long local_390;
  undefined8 uStack_388;
  long *local_380;
  size_type local_378;
  long local_370;
  undefined8 uStack_368;
  long *local_360;
  size_type local_358;
  long local_350;
  undefined8 uStack_348;
  undefined1 local_340 [40];
  string local_318 [11];
  ostringstream local_1a0 [376];
  
  lVar4 = *(long *)this;
  iVar3 = *(int *)(lVar4 + 4);
  iVar2 = *rhs;
  std::__cxx11::string::string((string *)&local_400,"==",&local_421);
  local_3c0 = local_3b0;
  if (local_400 == local_3f0) {
    uStack_3a8 = uStack_3e8;
  }
  else {
    local_3c0 = local_400;
  }
  local_3b8 = local_3f8;
  local_3f8 = 0;
  local_3f0[0] = 0;
  local_400 = local_3f0;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  puVar1 = (uint *)((long)&local_318[0].field_2 +
                   *(long *)(local_318[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar1 = *puVar1 | 1;
  poVar5 = std::operator<<((ostream *)local_318,"[V:");
  to_string<int>(&local_3e0,(int *)(lVar4 + 4));
  poVar5 = std::operator<<(poVar5,(string *)&local_3e0);
  std::operator<<(poVar5,"]");
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p == &local_3e0.field_2) {
    uStack_388 = local_3e0.field_2._8_8_;
    local_3a0 = &local_390;
  }
  else {
    local_3a0 = (long *)local_3e0._M_dataplus._M_p;
  }
  local_390._1_7_ = local_3e0.field_2._M_allocated_capacity._1_7_;
  local_398 = local_3e0._M_string_length;
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  local_360 = &local_350;
  if (local_3a0 == &local_390) {
    uStack_348 = uStack_388;
  }
  else {
    local_360 = local_3a0;
  }
  local_358 = local_398;
  local_398 = 0;
  local_390 = (ulong)local_390._1_7_ << 8;
  local_3a0 = &local_390;
  std::__cxx11::string::~string((string *)&local_3a0);
  poVar5 = std::operator<<((ostream *)local_1a0,(string *)&local_360);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,(string *)&local_3c0);
  poVar5 = std::operator<<(poVar5," ");
  to_string<int>(local_318,rhs);
  std::operator<<(poVar5,(string *)local_318);
  std::__cxx11::string::~string((string *)local_318);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318[0]._M_dataplus._M_p == &local_318[0].field_2) {
    uStack_408 = local_318[0].field_2._8_8_;
    local_420 = &local_410;
  }
  else {
    local_420 = (long *)local_318[0]._M_dataplus._M_p;
  }
  local_410._1_7_ = local_318[0].field_2._M_allocated_capacity._1_7_;
  local_418 = local_318[0]._M_string_length;
  local_318[0]._M_string_length = 0;
  local_318[0].field_2._M_local_buf[0] = '\0';
  local_318[0]._M_dataplus._M_p = (pointer)&local_318[0].field_2;
  std::__cxx11::string::~string((string *)local_318);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  local_378 = local_418;
  local_380 = &local_370;
  if (local_420 == &local_410) {
    uStack_368 = uStack_408;
  }
  else {
    local_380 = local_420;
  }
  local_418 = 0;
  local_410 = (ulong)local_410._1_7_ << 8;
  local_420 = &local_410;
  local_340[0] = iVar3 == iVar2;
  std::__cxx11::string::string((string *)(local_340 + 8),(string *)&local_380);
  result::result(__return_storage_ptr__,(result *)local_340);
  std::__cxx11::string::~string((string *)(local_340 + 8));
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_400);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }